

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall psy::C::SyntaxDumper::visitTypeName(SyntaxDumper *this,TypeNameSyntax *node)

{
  DeclaratorSyntax *pDVar1;
  SpecifierListSyntax *local_20;
  SpecifierListSyntax *it;
  TypeNameSyntax *node_local;
  SyntaxDumper *this_local;
  
  for (local_20 = TypeNameSyntax::specifiers(node); local_20 != (SpecifierListSyntax *)0x0;
      local_20 = (local_20->
                 super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                 ).
                 super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                 .next) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(local_20->
                    super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    ).
                    super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    .value);
  }
  pDVar1 = TypeNameSyntax::declarator(node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pDVar1);
  return Skip;
}

Assistant:

virtual Action visitTypeName(const TypeNameSyntax* node) override
    {
        for (auto it = node->specifiers(); it; it = it->next)
            nonterminal(it->value);
        nonterminal(node->declarator());
        return Action::Skip;
    }